

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSGetNumMassPrecEvals(void *arkode_mem,long *npevals)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassPrecEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *npevals = local_18->npe;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassPrecEvals(void *arkode_mem, long int *npevals)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassPrecEvals",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *npevals = arkls_mem->npe;
  return(ARKLS_SUCCESS);
}